

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O3

bool __thiscall Times<1,_1,_0>::check(Times<1,_1,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  IntVar *pIVar3;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  pIVar3 = (this->z).var;
  return (long)-(&pIVar2->min)[(ulong)pIVar2->in_scip * 4].v *
         (long)-(&pIVar1->min)[(ulong)pIVar1->in_scip * 4].v -
         (long)(&pIVar3->min)[(ulong)pIVar3->in_scip * 4].v == 0;
}

Assistant:

int64_t getShadowVal() const {
		int64_t v = (type & 1) != 0 ? -var->getShadowVal() : var->getShadowVal();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}